

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O3

void __thiscall Timer::restart(Timer *this,int interval,int flags,shared_ptr<EventLoop> *l)

{
  element_type *peVar1;
  int iVar2;
  SharedPtr loop;
  EventLoop *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  peVar1 = (l->super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    EventLoop::eventLoop();
  }
  else {
    local_48 = (l->super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    local_50 = peVar1;
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_48->_M_use_count = local_48->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_48->_M_use_count = local_48->_M_use_count + 1;
      }
    }
  }
  if (local_50 != (EventLoop *)0x0) {
    if (this->timerId != 0) {
      EventLoop::unregisterTimer(local_50,this->timerId);
    }
    local_40._8_8_ = 0;
    local_40._M_unused._M_object = operator_new(0x18);
    *(code **)local_40._M_unused._0_8_ = timerFired;
    *(undefined8 *)((long)local_40._M_unused._0_8_ + 8) = 0;
    *(Timer **)((long)local_40._M_unused._0_8_ + 0x10) = this;
    local_28 = std::
               _Function_handler<void_(int),_std::_Bind<void_(Timer::*(Timer_*,_std::_Placeholder<1>))(int)>_>
               ::_M_invoke;
    local_30 = std::
               _Function_handler<void_(int),_std::_Bind<void_(Timer::*(Timer_*,_std::_Placeholder<1>))(int)>_>
               ::_M_manager;
    iVar2 = EventLoop::registerTimer(local_50,(function<void_(int)> *)&local_40,interval,flags);
    this->timerId = iVar2;
    if (local_30 != (code *)0x0) {
      (*local_30)(&local_40,&local_40,__destroy_functor);
    }
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  return;
}

Assistant:

void Timer::restart(int interval, int flags, const std::shared_ptr<EventLoop> &l)
{
    EventLoop::SharedPtr loop = l ? l : EventLoop::eventLoop();
    if (loop) {
        // ### this is a bit inefficient, should revisit
        if (timerId)
            loop->unregisterTimer(timerId);
        timerId = loop->registerTimer(std::bind(&Timer::timerFired, this, std::placeholders::_1),
                                      interval, flags);
    }
}